

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

StringRef __thiscall llvm::sys::path::stem(path *this,StringRef path,Style style)

{
  bool bVar1;
  char *pcVar2;
  StringRef RHS;
  StringRef RHS_00;
  StringRef SVar3;
  StringRef path_00;
  StringRef LHS;
  StringRef LHS_00;
  undefined1 local_28 [8];
  StringRef fname;
  
  path_00.Length = path.Data;
  path_00.Data = (char *)this;
  _local_28 = filename(path_00,(Style)path.Length);
  pcVar2 = (char *)StringRef::rfind((StringRef *)local_28,'.',0xffffffffffffffff);
  if (pcVar2 == (char *)0xffffffffffffffff) goto LAB_00b649a5;
  if (fname.Data == (char *)0x1) {
    RHS.Length = 1;
    RHS.Data = ".";
    LHS.Length = 1;
    LHS.Data = (char *)local_28;
    bVar1 = llvm::operator==(LHS,RHS);
    if (!bVar1) {
      goto LAB_00b64974;
    }
LAB_00b64994:
  }
  else {
LAB_00b64974:
    if (fname.Data == (char *)0x2) {
      RHS_00.Length = 2;
      RHS_00.Data = "..";
      LHS_00.Length = 2;
      LHS_00.Data = (char *)local_28;
      bVar1 = llvm::operator==(LHS_00,RHS_00);
      if (bVar1) goto LAB_00b64994;
    }
    if (pcVar2 <= fname.Data) {
      fname.Data = pcVar2;
    }
  }
LAB_00b649a5:
  SVar3.Length = (size_t)fname.Data;
  SVar3.Data = (char *)local_28;
  return SVar3;
}

Assistant:

StringRef stem(StringRef path, Style style) {
  StringRef fname = filename(path, style);
  size_t pos = fname.find_last_of('.');
  if (pos == StringRef::npos)
    return fname;
  else
    if ((fname.size() == 1 && fname == ".") ||
        (fname.size() == 2 && fname == ".."))
      return fname;
    else
      return fname.substr(0, pos);
}